

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

void __thiscall cfgfile::generator::cfg::model_t::model_t(model_t *this,model_t *other)

{
  _Rb_tree_header *p_Var1;
  
  namespace_t::namespace_t(&this->m_root,&other->m_root);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_global_includes,&other->m_global_includes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_relative_includes,&other->m_relative_includes);
  std::__cxx11::string::string((string *)&this->m_include_guard,(string *)&other->m_include_guard);
  p_Var1 = &(this->m_indexes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

model_t::model_t( const model_t & other )
	:	m_root( other.root_namespace() )
	,	m_global_includes( other.global_includes() )
	,	m_relative_includes( other.relative_includes() )
	,	m_include_guard( other.include_guard() )
{
}